

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Init(sqlite3 *db,char **pzErrMsg)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  Db *pDVar4;
  long lVar5;
  long lVar6;
  
  uVar2 = db->flags;
  (db->init).busy = '\x01';
  pDVar4 = db->aDb;
  db->enc = pDVar4->pSchema->enc;
  if (0 < db->nDb) {
    lVar5 = 0x18;
    lVar6 = 0;
    do {
      if (lVar6 != 1 && (*(byte *)(*(long *)((long)&pDVar4->zDbSName + lVar5) + 0x72) & 1) == 0) {
        iVar3 = sqlite3InitOne(db,(int)lVar6,pzErrMsg);
        if (iVar3 != 0) {
          sqlite3ResetOneSchema(db,(int)lVar6);
          goto LAB_0012283e;
        }
      }
      lVar6 = lVar6 + 1;
      pDVar4 = db->aDb;
      lVar5 = lVar5 + 0x20;
    } while (lVar6 < db->nDb);
  }
  if ((((pDVar4[1].pSchema)->schemaFlags & 1) != 0) ||
     (iVar3 = sqlite3InitOne(db,1,pzErrMsg), iVar3 == 0)) {
    (db->init).busy = '\0';
    if ((uVar2 >> 0x17 & 1) == 0) {
      pbVar1 = (byte *)((long)&db->flags + 2);
      *pbVar1 = *pbVar1 & 0x7f;
    }
    return 0;
  }
  sqlite3SchemaClear(db->aDb[1].pSchema);
LAB_0012283e:
  (db->init).busy = '\0';
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3Init(sqlite3 *db, char **pzErrMsg){
  int i, rc;
  int commit_internal = !(db->flags&SQLITE_InternChanges);
  
  assert( sqlite3_mutex_held(db->mutex) );
  assert( sqlite3BtreeHoldsMutex(db->aDb[0].pBt) );
  assert( db->init.busy==0 );
  rc = SQLITE_OK;
  db->init.busy = 1;
  ENC(db) = SCHEMA_ENC(db);
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
    if( DbHasProperty(db, i, DB_SchemaLoaded) || i==1 ) continue;
    rc = sqlite3InitOne(db, i, pzErrMsg);
    if( rc ){
      sqlite3ResetOneSchema(db, i);
    }
  }

  /* Once all the other databases have been initialized, load the schema
  ** for the TEMP database. This is loaded last, as the TEMP database
  ** schema may contain references to objects in other databases.
  */
#ifndef SQLITE_OMIT_TEMPDB
  assert( db->nDb>1 );
  if( rc==SQLITE_OK && !DbHasProperty(db, 1, DB_SchemaLoaded) ){
    rc = sqlite3InitOne(db, 1, pzErrMsg);
    if( rc ){
      sqlite3ResetOneSchema(db, 1);
    }
  }
#endif

  db->init.busy = 0;
  if( rc==SQLITE_OK && commit_internal ){
    sqlite3CommitInternalChanges(db);
  }

  return rc; 
}